

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlStrEqual(xmlChar *str1,xmlChar *str2)

{
  xmlChar xVar1;
  xmlChar *local_20;
  xmlChar *str2_local;
  xmlChar *str1_local;
  
  if (str1 == str2) {
    str1_local._4_4_ = 1;
  }
  else if (str1 == (xmlChar *)0x0) {
    str1_local._4_4_ = 0;
  }
  else {
    local_20 = str2;
    str2_local = str1;
    if (str2 == (xmlChar *)0x0) {
      str1_local._4_4_ = 0;
    }
    else {
      do {
        if (*str2_local != *local_20) {
          return 0;
        }
        xVar1 = *local_20;
        local_20 = local_20 + 1;
        str2_local = str2_local + 1;
      } while (xVar1 != '\0');
      str1_local._4_4_ = 1;
    }
  }
  return str1_local._4_4_;
}

Assistant:

int
xmlStrEqual(const xmlChar *str1, const xmlChar *str2) {
    if (str1 == str2) return(1);
    if (str1 == NULL) return(0);
    if (str2 == NULL) return(0);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    return(strcmp((const char *)str1, (const char *)str2) == 0);
#else
    do {
        if (*str1++ != *str2) return(0);
    } while (*str2++);
    return(1);
#endif
}